

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc.c
# Opt level: O2

uc_err uc_reg_write_batch(uc_engine *uc,int *regs,void **vals,int count)

{
  uc_mode uVar1;
  reg_write_t p_Var2;
  void *pvVar3;
  uc_err uVar4;
  ulong uVar5;
  ulong uVar6;
  int setpc;
  size_t size;
  int local_54;
  uc_engine *local_50;
  int *local_48;
  void **local_40;
  size_t local_38;
  
  local_48 = regs;
  local_40 = vals;
  if ((uc->init_done != false) || (uVar4 = uc_init_engine(uc), uVar4 == UC_ERR_OK)) {
    p_Var2 = uc->reg_write;
    pvVar3 = uc->cpu->env_ptr;
    uVar1 = uc->mode;
    local_54 = 0;
    uVar5 = 0;
    uVar6 = (ulong)(uint)count;
    local_50 = uc;
    if (count < 1) {
      uVar6 = uVar5;
    }
    do {
      if (uVar6 == uVar5) {
        if (local_54 == 0) {
          return UC_ERR_OK;
        }
        local_50->quit_request = true;
        break_translation_loop(local_50);
        return UC_ERR_OK;
      }
      local_38 = 0xffffffffffffffff;
      uVar4 = (*p_Var2)(pvVar3,uVar1,local_48[uVar5],local_40[uVar5],&local_38,&local_54);
      uVar5 = uVar5 + 1;
    } while (uVar4 == UC_ERR_OK);
  }
  return uVar4;
}

Assistant:

UNICORN_EXPORT
uc_err uc_reg_write_batch(uc_engine *uc, int *regs, void *const *vals,
                          int count)
{
    UC_INIT(uc);
    reg_write_t reg_write = uc->reg_write;
    void *env = uc->cpu->env_ptr;
    int mode = uc->mode;
    int setpc = 0;
    int i;

    for (i = 0; i < count; i++) {
        unsigned int regid = regs[i];
        const void *value = vals[i];
        size_t size = (size_t)-1;
        uc_err err = reg_write(env, mode, regid, value, &size, &setpc);
        if (err) {
            return err;
        }
    }
    if (setpc) {
        // force to quit execution and flush TB
        uc->quit_request = true;
        break_translation_loop(uc);
    }

    return UC_ERR_OK;
}